

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void thread_main(void *arg)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t n;
  char buf [4096];
  thread_ctx *ctx;
  void *arg_local;
  
  buf._4088_8_ = arg;
  uv_barrier_wait((uv_barrier_t *)arg);
  do {
    sVar1 = read(*(int *)(buf._4088_8_ + 0x20),&n,0x1000);
    bVar3 = true;
    if ((sVar1 < 1) && (bVar3 = false, sVar1 == -1)) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  if (sVar1 == 0) {
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-pipe-set-non-blocking.c"
          ,0x33,"n == 0");
  abort();
}

Assistant:

static void thread_main(void* arg) {
  const struct thread_ctx* ctx;
  int size;
  char* data;

  ctx = (struct thread_ctx*)arg;
  size = ctx->size;
  data = ctx->data;

  while (size > 0) {
    ssize_t result;
    int nbytes;
    nbytes = size < ctx->interval ? size : ctx->interval;
    if (ctx->doread) {
      result = write(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors) */
      ASSERT(result == nbytes);
    } else {
      result = read(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors),
       * but might get a partial read if we are faster than the writer
       */
      ASSERT(result > 0 && result <= nbytes);
    }

    pthread_kill(ctx->pid, SIGUSR1);
    size -= result;
    data += result;
  }
}